

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__slurp(char *filename,char *buf,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  int fd;
  ssize_t n;
  size_t len_local;
  char *buf_local;
  char *filename_local;
  
  if (len == 0) {
    __assert_fail("len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                  ,0x418,"int uv__slurp(const char *, char *, size_t)");
  }
  filename_local._4_4_ = uv__open_cloexec(filename,0);
  if (-1 < filename_local._4_4_) {
    do {
      sVar2 = read(filename_local._4_4_,buf,len - 1);
      bVar4 = false;
      if (sVar2 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    iVar1 = uv__close_nocheckstdio(filename_local._4_4_);
    if (iVar1 != 0) {
      abort();
    }
    if (sVar2 < 0) {
      piVar3 = __errno_location();
      filename_local._4_4_ = -*piVar3;
    }
    else {
      buf[sVar2] = '\0';
      filename_local._4_4_ = 0;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int uv__slurp(const char* filename, char* buf, size_t len) {
  ssize_t n;
  int fd;

  assert(len > 0);

  fd = uv__open_cloexec(filename, O_RDONLY);
  if (fd < 0)
    return fd;

  do
    n = read(fd, buf, len - 1);
  while (n == -1 && errno == EINTR);

  if (uv__close_nocheckstdio(fd))
    abort();

  if (n < 0)
    return UV__ERR(errno);

  buf[n] = '\0';

  return 0;
}